

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::ArrayReductionMethod::ArrayReductionMethod
          (ArrayReductionMethod *this,KnownSystemName knownNameId,Operator op)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005a31c0;
  (this->op).callback = op.callback;
  (this->op).callable = op.callable;
  (this->super_SystemSubroutine).withClauseMode = Iterator;
  return;
}

Assistant:

ArrayReductionMethod(KnownSystemName knownNameId, Operator op) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), op(op) {
        withClauseMode = WithClauseMode::Iterator;
    }